

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_file.hpp
# Opt level: O0

void __thiscall
coro_io::basic_seq_coro_file<(coro_io::execution_type)2>::basic_seq_coro_file
          (basic_seq_coro_file<(coro_io::execution_type)2> *this,string_view filepath,
          openmode open_flags,executor_type *executor)

{
  uint in_ECX;
  int in_EDX;
  char *in_RSI;
  basic_seq_coro_file<(coro_io::execution_type)2> *in_RDI;
  basic_executor_type<std::allocator<void>,_0UL> *in_R8;
  basic_executor_type<std::allocator<void>,_0UL> *in_stack_ffffffffffffffc8;
  basic_executor_type<std::allocator<void>,_0UL> in_stack_ffffffffffffffd0;
  
  asio::io_context::basic_executor_type<std::allocator<void>,_0UL>::basic_executor_type
            ((basic_executor_type<std::allocator<void>,_0UL> *)&stack0xffffffffffffffd0,in_R8);
  ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>::
  ExecutorWrapper((ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>
                   *)in_stack_ffffffffffffffd0.target_,in_stack_ffffffffffffffc8);
  asio::io_context::basic_executor_type<std::allocator<void>,_0UL>::~basic_executor_type
            ((basic_executor_type<std::allocator<void>,_0UL> *)&stack0xffffffffffffffd0);
  std::fstream::fstream(&in_RDI->frw_seq_file_);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  in_RDI->eof_ = false;
  open(in_RDI,in_RSI,in_EDX,(ulong)in_ECX);
  return;
}

Assistant:

basic_seq_coro_file(std::string_view filepath,
                      std::ios::ios_base::openmode open_flags,
                      asio::io_context::executor_type executor)
      : executor_wrapper_(executor) {
    open(filepath, open_flags);
  }